

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

int __thiscall
nanoflann::
KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
::init(KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
       *this,EVP_PKEY_CTX *ctx)

{
  BoundingBox *bbox;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *pvVar1;
  NodePtr pNVar2;
  Size SVar3;
  Size *in_RDX;
  
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).root_node = (NodePtr)0x0;
  pvVar1 = this->dataset->m_data;
  SVar3 = (long)(pvVar1->
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar1->
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).m_size = SVar3;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).m_size_at_index_build = SVar3;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).dim = 2;
  SVar3 = *in_RDX;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).m_leaf_max_size = SVar3;
  if ((in_RDX[1] & 1) != 0) {
    return (int)SVar3;
  }
  pvVar1 = this->dataset->m_data;
  SVar3 = (long)(pvVar1->
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar1->
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).m_size = SVar3;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).m_size_at_index_build = SVar3;
  init_vind(this);
  PooledAllocator::free_all
            (&(this->
              super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
              ).pool);
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).root_node = (NodePtr)0x0;
  pNVar2 = (NodePtr)(this->
                    super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                    ).m_size;
  (this->
  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
  ).m_size_at_index_build = (Size)pNVar2;
  if (pNVar2 != (NodePtr)0x0) {
    bbox = &(this->
            super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
            ).root_bbox;
    computeBoundingBox(this,bbox);
    pNVar2 = KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
             ::divideTree(&this->
                           super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                          ,this,0,(this->
                                  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                                  ).m_size,bbox);
    (this->
    super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
    ).root_node = pNVar2;
  }
  return (int)pNVar2;
}

Assistant:

void init(
        const Dimension                       dimensionality,
        const KDTreeSingleIndexAdaptorParams& params)
    {
        BaseClassRef::root_node             = nullptr;
        BaseClassRef::m_size                = dataset.kdtree_get_point_count();
        BaseClassRef::m_size_at_index_build = BaseClassRef::m_size;
        BaseClassRef::dim                   = dimensionality;
        if (DIM > 0) BaseClassRef::dim = DIM;
        BaseClassRef::m_leaf_max_size = params.leaf_max_size;

        if (!(params.flags &
              KDTreeSingleIndexAdaptorFlags::SkipInitialBuildIndex))
        {
            buildIndex();
        }
    }